

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operations.cpp
# Opt level: O3

bool duckdb::TemplatedBooleanOperation<duckdb::GreaterThan>(Value *left,Value *right)

{
  PhysicalType PVar1;
  element_type *peVar2;
  element_type *peVar3;
  bool bVar4;
  byte bVar5;
  int8_t iVar6;
  int8_t iVar7;
  int16_t iVar8;
  int16_t iVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  int32_t iVar14;
  int32_t iVar15;
  int iVar16;
  vector<duckdb::Value,_true> *pvVar17;
  vector<duckdb::Value,_true> *pvVar18;
  const_reference pvVar19;
  const_reference pvVar20;
  ulong uVar21;
  int64_t iVar22;
  int64_t iVar23;
  uint64_t uVar24;
  uint64_t uVar25;
  string *psVar26;
  InternalException *this;
  ulong uVar27;
  long lVar28;
  byte bVar29;
  long lVar30;
  long lVar31;
  size_type sVar32;
  long lVar33;
  bool bVar34;
  bool bVar35;
  hugeint_t hVar36;
  hugeint_t hVar37;
  interval_t iVar38;
  interval_t iVar39;
  LogicalType LStack_c8;
  Value local_b0;
  Value local_70;
  
LAB_00338c89:
  bVar4 = LogicalType::operator==(&left->type_,&right->type_);
  peVar3 = local_70.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2 = local_b0.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (!bVar4) {
    Value::Value(&local_b0,left);
    Value::Value(&local_70,right);
    LogicalType::ForceMaxLogicalType(&LStack_c8,&left->type_,&right->type_);
    bVar4 = Value::DefaultTryCastAs(&local_b0,&LStack_c8,false);
    if ((bVar4) && (bVar4 = Value::DefaultTryCastAs(&local_70,&LStack_c8,false), bVar4)) {
      bVar29 = TemplatedBooleanOperation<duckdb::GreaterThan>(&local_b0,&local_70);
    }
    else {
      bVar29 = false;
    }
    LogicalType::~LogicalType(&LStack_c8);
    Value::~Value(&local_70);
    Value::~Value(&local_b0);
    goto LAB_003392dd;
  }
  PVar1 = (left->type_).physical_type_;
  local_b0.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  if (199 < PVar1) {
    if (PVar1 == VARCHAR) {
      psVar26 = StringValue::Get_abi_cxx11_(left);
      StringValue::Get_abi_cxx11_(right);
      iVar16 = ::std::__cxx11::string::compare((string *)psVar26);
      bVar35 = false;
      bVar34 = iVar16 < 0;
      bVar4 = iVar16 == 0;
      goto LAB_003392c1;
    }
    if (PVar1 == UINT128) {
      local_b0.type_._0_16_ = Value::GetValueUnsafe<duckdb::uhugeint_t>(left);
      local_70.type_._0_16_ = Value::GetValueUnsafe<duckdb::uhugeint_t>(right);
      bVar29 = uhugeint_t::operator>((uhugeint_t *)&local_b0,(uhugeint_t *)&local_70);
    }
    else {
      if (PVar1 != INT128) goto switchD_00338cbf_caseD_a;
      hVar36 = Value::GetValueUnsafe<duckdb::hugeint_t>(left);
      lVar31 = hVar36.upper;
      hVar37 = Value::GetValueUnsafe<duckdb::hugeint_t>(right);
      lVar28 = hVar37.upper;
      bVar29 = hVar37.lower < hVar36.lower && lVar31 == lVar28 ||
               lVar31 != lVar28 && lVar28 <= lVar31;
    }
    goto LAB_003392dd;
  }
  switch(PVar1) {
  case BOOL:
    bVar4 = Value::GetValueUnsafe<bool>(left);
    bVar34 = Value::GetValueUnsafe<bool>(right);
    bVar29 = !bVar34 && bVar4;
    goto LAB_003392dd;
  case UINT8:
    bVar29 = Value::GetValueUnsafe<unsigned_char>(left);
    bVar5 = Value::GetValueUnsafe<unsigned_char>(right);
    bVar4 = bVar29 < bVar5;
    bVar34 = bVar29 == bVar5;
    goto LAB_003392d9;
  case INT8:
    iVar6 = Value::GetValueUnsafe<signed_char>(left);
    iVar7 = Value::GetValueUnsafe<signed_char>(right);
    bVar35 = SBORROW1(iVar6,iVar7);
    bVar34 = (char)(iVar6 - iVar7) < '\0';
    bVar4 = iVar6 == iVar7;
    break;
  case UINT16:
    uVar10 = Value::GetValueUnsafe<unsigned_short>(left);
    uVar11 = Value::GetValueUnsafe<unsigned_short>(right);
    bVar4 = uVar10 < uVar11;
    bVar34 = uVar10 == uVar11;
    goto LAB_003392d9;
  case INT16:
    iVar8 = Value::GetValueUnsafe<short>(left);
    iVar9 = Value::GetValueUnsafe<short>(right);
    bVar35 = SBORROW2(iVar8,iVar9);
    bVar34 = (short)(iVar8 - iVar9) < 0;
    bVar4 = iVar8 == iVar9;
    break;
  case UINT32:
    uVar12 = Value::GetValueUnsafe<unsigned_int>(left);
    uVar13 = Value::GetValueUnsafe<unsigned_int>(right);
    bVar4 = uVar12 < uVar13;
    bVar34 = uVar12 == uVar13;
    goto LAB_003392d9;
  case INT32:
    iVar14 = Value::GetValueUnsafe<int>(left);
    iVar15 = Value::GetValueUnsafe<int>(right);
    bVar35 = SBORROW4(iVar14,iVar15);
    bVar34 = iVar14 - iVar15 < 0;
    bVar4 = iVar14 == iVar15;
    break;
  case UINT64:
    uVar24 = Value::GetValueUnsafe<unsigned_long>(left);
    uVar25 = Value::GetValueUnsafe<unsigned_long>(right);
    bVar4 = uVar24 < uVar25;
    bVar34 = uVar24 == uVar25;
    goto LAB_003392d9;
  case INT64:
    iVar22 = Value::GetValueUnsafe<long>(left);
    iVar23 = Value::GetValueUnsafe<long>(right);
    bVar35 = SBORROW8(iVar22,iVar23);
    bVar34 = iVar22 - iVar23 < 0;
    bVar4 = iVar22 == iVar23;
    break;
  default:
switchD_00338cbf_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_b0.type_._0_8_ =
         (uhugeint_t *)
         &local_b0.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Unimplemented type for value comparison","");
    InternalException::InternalException(this,(string *)&local_b0);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_b0.type_._0_4_ = Value::GetValueUnsafe<float>(left);
    local_70.type_._0_4_ = Value::GetValueUnsafe<float>(right);
    bVar29 = GreaterThan::Operation<float>((float *)&local_b0,(float *)&local_70);
    goto LAB_003392dd;
  case DOUBLE:
    local_70.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    local_b0.type_._0_8_ = Value::GetValueUnsafe<double>(left);
    local_70.type_._0_8_ = Value::GetValueUnsafe<double>(right);
    bVar29 = GreaterThan::Operation<double>((double *)&local_b0,(double *)&local_70);
    goto LAB_003392dd;
  case INTERVAL:
    iVar38 = Value::GetValueUnsafe<duckdb::interval_t>(left);
    iVar39 = Value::GetValueUnsafe<duckdb::interval_t>(right);
    lVar30 = (iVar38._0_8_ >> 0x20) + iVar38.micros / 86400000000;
    lVar28 = (long)iVar38.months + lVar30 / 0x1e;
    lVar31 = (iVar39._0_8_ >> 0x20) + iVar39.micros / 86400000000;
    lVar33 = (long)iVar39.months + lVar31 / 0x1e;
    bVar29 = 1;
    if (lVar33 < lVar28) goto LAB_003392dd;
    if (lVar33 <= lVar28) {
      lVar30 = lVar30 % 0x1e;
      lVar31 = lVar31 % 0x1e;
      if (lVar30 <= lVar31) {
        bVar29 = iVar39.micros % 86400000000 < iVar38.micros % 86400000000 && lVar31 <= lVar30;
      }
      goto LAB_003392dd;
    }
    goto LAB_0033902b;
  case LIST:
    pvVar17 = ListValue::GetChildren(left);
    pvVar18 = ListValue::GetChildren(right);
    uVar21 = (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar21 == 0) {
      uVar21 = 0;
      goto LAB_003392cf;
    }
    if ((pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_003392cf;
    sVar32 = 0;
    goto LAB_003391b6;
  case STRUCT:
    pvVar17 = StructValue::GetChildren(left);
    pvVar18 = StructValue::GetChildren(right);
    sVar32 = 0;
    if ((long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start != 0x40) {
      do {
        pvVar19 = vector<duckdb::Value,_true>::operator[](pvVar17,sVar32);
        pvVar20 = vector<duckdb::Value,_true>::operator[](pvVar18,sVar32);
        if (pvVar19->is_null == true) {
          if (pvVar20->is_null == false) goto LAB_00339268;
        }
        else if ((pvVar20->is_null == false) &&
                (bVar4 = TemplatedBooleanOperation<duckdb::GreaterThan>(pvVar19,pvVar20), bVar4))
        goto LAB_00339268;
        pvVar19 = vector<duckdb::Value,_true>::operator[](pvVar17,sVar32);
        pvVar20 = vector<duckdb::Value,_true>::operator[](pvVar18,sVar32);
        if (((pvVar19->is_null != true) || ((pvVar20->is_null & 1U) == 0)) &&
           ((pvVar19->is_null != pvVar20->is_null ||
            (bVar4 = TemplatedBooleanOperation<duckdb::Equals>(pvVar19,pvVar20), !bVar4))))
        goto LAB_0033902b;
        sVar32 = sVar32 + 1;
      } while (sVar32 < ((long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                               ).super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                               ).super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 6) - 1U);
    }
    left = vector<duckdb::Value,_true>::operator[](pvVar17,sVar32);
    right = vector<duckdb::Value,_true>::operator[](pvVar18,sVar32);
    if (left->is_null != true) goto code_r0x00338db7;
    bVar29 = right->is_null ^ 1;
    goto LAB_003392dd;
  case ARRAY:
    pvVar17 = ArrayValue::GetChildren(left);
    pvVar18 = ArrayValue::GetChildren(right);
    if ((pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_00339268;
    sVar32 = 0;
    goto LAB_00338ec4;
  }
LAB_003392c1:
  bVar29 = !bVar4 && bVar35 == bVar34;
  goto LAB_003392dd;
  while( true ) {
    pvVar19 = vector<duckdb::Value,_true>::operator[](pvVar17,sVar32);
    pvVar20 = vector<duckdb::Value,_true>::operator[](pvVar18,sVar32);
    if (((pvVar19->is_null != true) || ((pvVar20->is_null & 1U) == 0)) &&
       ((pvVar19->is_null != pvVar20->is_null ||
        (bVar4 = TemplatedBooleanOperation<duckdb::Equals>(pvVar19,pvVar20), !bVar4)))) {
      bVar29 = 0;
      uVar21 = 0;
      goto LAB_00339339;
    }
    sVar32 = sVar32 + 1;
    uVar21 = (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_start >> 6;
    if (uVar21 <= sVar32) break;
LAB_00338ec4:
    pvVar19 = vector<duckdb::Value,_true>::operator[](pvVar17,sVar32);
    pvVar20 = vector<duckdb::Value,_true>::operator[](pvVar18,sVar32);
    if (pvVar19->is_null == true) {
      if (pvVar20->is_null == false) {
LAB_00339335:
        uVar21 = 1;
        bVar29 = 0;
        goto LAB_00339339;
      }
    }
    else if ((pvVar20->is_null == false) &&
            (bVar4 = TemplatedBooleanOperation<duckdb::GreaterThan>(pvVar19,pvVar20), bVar4))
    goto LAB_00339335;
  }
  bVar29 = 1;
LAB_00339339:
  bVar29 = bVar29 | (byte)uVar21;
  goto LAB_003392dd;
code_r0x00338db7:
  if (right->is_null != false) goto LAB_0033902b;
  goto LAB_00338c89;
LAB_00339268:
  bVar29 = 1;
  goto LAB_003392dd;
LAB_0033902b:
  bVar29 = 0;
  goto LAB_003392dd;
  while( true ) {
    pvVar19 = vector<duckdb::Value,_true>::operator[](pvVar17,sVar32);
    pvVar20 = vector<duckdb::Value,_true>::operator[](pvVar18,sVar32);
    if (((pvVar19->is_null != true) || ((pvVar20->is_null & 1U) == 0)) &&
       ((pvVar19->is_null != pvVar20->is_null ||
        (bVar4 = TemplatedBooleanOperation<duckdb::Equals>(pvVar19,pvVar20), !bVar4))))
    goto LAB_0033902b;
    uVar21 = (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_start;
    sVar32 = sVar32 + 1;
    if ((sVar32 == (long)uVar21 >> 6) ||
       (sVar32 == (long)(pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start >> 6)) break;
LAB_003391b6:
    pvVar19 = vector<duckdb::Value,_true>::operator[](pvVar17,sVar32);
    pvVar20 = vector<duckdb::Value,_true>::operator[](pvVar18,sVar32);
    if (pvVar19->is_null == true) {
      if (pvVar20->is_null == false) goto LAB_00339268;
    }
    else if ((pvVar20->is_null == false) &&
            (bVar4 = TemplatedBooleanOperation<duckdb::GreaterThan>(pvVar19,pvVar20), bVar4))
    goto LAB_00339268;
  }
LAB_003392cf:
  uVar27 = (long)(pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_start;
  bVar4 = uVar21 < uVar27;
  bVar34 = uVar21 == uVar27;
LAB_003392d9:
  bVar29 = !bVar4 && !bVar34;
LAB_003392dd:
  return (bool)(bVar29 & 1);
}

Assistant:

static bool TemplatedBooleanOperation(const Value &left, const Value &right) {
	const auto &left_type = left.type();
	const auto &right_type = right.type();
	if (left_type != right_type) {
		Value left_copy = left;
		Value right_copy = right;

		auto comparison_type = LogicalType::ForceMaxLogicalType(left_type, right_type);
		if (!left_copy.DefaultTryCastAs(comparison_type) || !right_copy.DefaultTryCastAs(comparison_type)) {
			return false;
		}
		D_ASSERT(left_copy.type() == right_copy.type());
		return TemplatedBooleanOperation<OP>(left_copy, right_copy);
	}
	switch (left_type.InternalType()) {
	case PhysicalType::BOOL:
		return OP::Operation(left.GetValueUnsafe<bool>(), right.GetValueUnsafe<bool>());
	case PhysicalType::INT8:
		return OP::Operation(left.GetValueUnsafe<int8_t>(), right.GetValueUnsafe<int8_t>());
	case PhysicalType::INT16:
		return OP::Operation(left.GetValueUnsafe<int16_t>(), right.GetValueUnsafe<int16_t>());
	case PhysicalType::INT32:
		return OP::Operation(left.GetValueUnsafe<int32_t>(), right.GetValueUnsafe<int32_t>());
	case PhysicalType::INT64:
		return OP::Operation(left.GetValueUnsafe<int64_t>(), right.GetValueUnsafe<int64_t>());
	case PhysicalType::UINT8:
		return OP::Operation(left.GetValueUnsafe<uint8_t>(), right.GetValueUnsafe<uint8_t>());
	case PhysicalType::UINT16:
		return OP::Operation(left.GetValueUnsafe<uint16_t>(), right.GetValueUnsafe<uint16_t>());
	case PhysicalType::UINT32:
		return OP::Operation(left.GetValueUnsafe<uint32_t>(), right.GetValueUnsafe<uint32_t>());
	case PhysicalType::UINT64:
		return OP::Operation(left.GetValueUnsafe<uint64_t>(), right.GetValueUnsafe<uint64_t>());
	case PhysicalType::UINT128:
		return OP::Operation(left.GetValueUnsafe<uhugeint_t>(), right.GetValueUnsafe<uhugeint_t>());
	case PhysicalType::INT128:
		return OP::Operation(left.GetValueUnsafe<hugeint_t>(), right.GetValueUnsafe<hugeint_t>());
	case PhysicalType::FLOAT:
		return OP::Operation(left.GetValueUnsafe<float>(), right.GetValueUnsafe<float>());
	case PhysicalType::DOUBLE:
		return OP::Operation(left.GetValueUnsafe<double>(), right.GetValueUnsafe<double>());
	case PhysicalType::INTERVAL:
		return OP::Operation(left.GetValueUnsafe<interval_t>(), right.GetValueUnsafe<interval_t>());
	case PhysicalType::VARCHAR:
		return OP::Operation(StringValue::Get(left), StringValue::Get(right));
	case PhysicalType::STRUCT: {
		auto &left_children = StructValue::GetChildren(left);
		auto &right_children = StructValue::GetChildren(right);
		// this should be enforced by the type
		D_ASSERT(left_children.size() == right_children.size());
		idx_t i = 0;
		for (; i < left_children.size() - 1; ++i) {
			if (ValuePositionComparator::Definite<OP>(left_children[i], right_children[i])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[i], right_children[i])) {
				return false;
			}
		}
		return ValuePositionComparator::Final<OP>(left_children[i], right_children[i]);
	}
	case PhysicalType::LIST: {
		auto &left_children = ListValue::GetChildren(left);
		auto &right_children = ListValue::GetChildren(right);
		for (idx_t pos = 0;; ++pos) {
			if (pos == left_children.size() || pos == right_children.size()) {
				return ValuePositionComparator::TieBreak<OP>(left_children.size(), right_children.size());
			}
			if (ValuePositionComparator::Definite<OP>(left_children[pos], right_children[pos])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[pos], right_children[pos])) {
				return false;
			}
		}
		return false;
	}
	case PhysicalType::ARRAY: {
		auto &left_children = ArrayValue::GetChildren(left);
		auto &right_children = ArrayValue::GetChildren(right);

		// Should be enforced by the type
		D_ASSERT(left_children.size() == right_children.size());

		for (idx_t i = 0; i < left_children.size(); i++) {
			if (ValuePositionComparator::Definite<OP>(left_children[i], right_children[i])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[i], right_children[i])) {
				return false;
			}
		}
		return true;
	}
	default:
		throw InternalException("Unimplemented type for value comparison");
	}
}